

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

leveldb * __thiscall leveldb::MakeFileName(leveldb *this,string *name,uint64_t number,char *suffix)

{
  char local_98 [8];
  char buf [100];
  char *suffix_local;
  uint64_t number_local;
  string *name_local;
  
  snprintf(local_98,100,"/%06llu.%s",number,suffix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)name);
  return this;
}

Assistant:

static std::string MakeFileName(const std::string &name, uint64_t number,
                                    const char *suffix) {
        char buf[100];
        snprintf(buf, sizeof(buf), "/%06llu.%s",
                 static_cast<unsigned long long>(number),
                 suffix);
        return name + buf;
    }